

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

Am_Wrapper * Am_Get_Computed_Colors_Record_Form_proc(Am_Object *self)

{
  uint *puVar1;
  Computed_Colors_Record CVar2;
  bool bVar3;
  Am_Value *pAVar4;
  Am_Ptr pvVar5;
  Am_Object window;
  Am_Style foreground_color;
  Am_Value value;
  Computed_Colors_Record local_10;
  
  Am_Style::Am_Style(&foreground_color);
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar4 = Am_Object::Get(self,0x6a,1);
  Am_Value::operator=(&value,pAVar4);
  if ((value.type & 0x7000) == 0x2000) {
    Am_Style::operator=(&foreground_color,&value);
  }
  window.data = (Am_Object_Data *)0x0;
  pAVar4 = Am_Object::Get(self,0x68,0);
  Am_Object::operator=(&window,pAVar4);
  bVar3 = Am_Object::Valid(&window);
  if (bVar3) {
    pAVar4 = Am_Object::Get(&window,0x7d2,0);
    pvVar5 = Am_Value::operator_cast_to_void_(pAVar4);
    CVar2 = black_and_white_rec;
    if ((pvVar5 != (Am_Ptr)0x0) && (*(int *)((long)pvVar5 + 0x54) == 1)) {
      if (black_and_white_rec.data == (Computed_Colors_Record_Data *)0x0) {
        local_10.data = (Computed_Colors_Record_Data *)0x0;
      }
      else {
        puVar1 = &((black_and_white_rec.data)->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 + 1;
        local_10 = CVar2;
      }
      goto LAB_0025fbac;
    }
  }
  Computed_Colors_Record::Computed_Colors_Record(&local_10,&foreground_color);
  if (local_10.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((local_10.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  Computed_Colors_Record::~Computed_Colors_Record(&local_10);
LAB_0025fbac:
  Am_Object::~Am_Object(&window);
  Am_Value::~Am_Value(&value);
  Am_Style::~Am_Style(&foreground_color);
  return &(local_10.data)->super_Am_Wrapper;
}

Assistant:

Am_Define_Formula(Am_Wrapper *, Am_Get_Computed_Colors_Record_Form)
{
  Am_Style foreground_color;
  Am_Value value;
  bool is_color = true;
  value = self.Peek(Am_FILL_STYLE);
  if (Am_Type_Class(value.type) == Am_WRAPPER)
    foreground_color = value;
  Am_Object window;
  window = self.Get(Am_WINDOW);
  if (window.Valid()) {
    Am_Drawonable *draw = Am_Drawonable::Narrow(window.Get(Am_DRAWONABLE));
    is_color = !draw || draw->Is_Color();
  }
  if (is_color)
    return Computed_Colors_Record(foreground_color);
  else
    return black_and_white_rec;
}